

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O2

void pem_pbkdf1(uchar *key,size_t keylen,uchar *iv,uchar *pwd,size_t pwdlen)

{
  bool bVar1;
  uchar md5sum [16];
  mbedtls_md5_context md5_ctx;
  
  mbedtls_md5_init(&md5_ctx);
  mbedtls_md5_starts(&md5_ctx);
  mbedtls_md5_update(&md5_ctx,pwd,pwdlen);
  mbedtls_md5_update(&md5_ctx,iv,8);
  mbedtls_md5_finish(&md5_ctx,md5sum);
  if (0x10 < keylen) {
    *(undefined8 *)key = md5sum._0_8_;
    *(undefined8 *)(key + 8) = md5sum._8_8_;
    mbedtls_md5_starts(&md5_ctx);
    mbedtls_md5_update(&md5_ctx,md5sum,0x10);
    mbedtls_md5_update(&md5_ctx,pwd,pwdlen);
    mbedtls_md5_update(&md5_ctx,iv,8);
    mbedtls_md5_finish(&md5_ctx,md5sum);
    bVar1 = 0x1f < keylen;
    keylen = keylen - 0x10;
    if (bVar1) {
      keylen = 0x10;
    }
    key = key + 0x10;
  }
  memcpy(key,md5sum,keylen);
  mbedtls_md5_free(&md5_ctx);
  mbedtls_zeroize(md5sum,0x10);
  return;
}

Assistant:

static void pem_pbkdf1( unsigned char *key, size_t keylen,
                        unsigned char *iv,
                        const unsigned char *pwd, size_t pwdlen )
{
    mbedtls_md5_context md5_ctx;
    unsigned char md5sum[16];
    size_t use_len;

    mbedtls_md5_init( &md5_ctx );

    /*
     * key[ 0..15] = MD5(pwd || IV)
     */
    mbedtls_md5_starts( &md5_ctx );
    mbedtls_md5_update( &md5_ctx, pwd, pwdlen );
    mbedtls_md5_update( &md5_ctx, iv,  8 );
    mbedtls_md5_finish( &md5_ctx, md5sum );

    if( keylen <= 16 )
    {
        memcpy( key, md5sum, keylen );

        mbedtls_md5_free( &md5_ctx );
        mbedtls_zeroize( md5sum, 16 );
        return;
    }

    memcpy( key, md5sum, 16 );

    /*
     * key[16..23] = MD5(key[ 0..15] || pwd || IV])
     */
    mbedtls_md5_starts( &md5_ctx );
    mbedtls_md5_update( &md5_ctx, md5sum,  16 );
    mbedtls_md5_update( &md5_ctx, pwd, pwdlen );
    mbedtls_md5_update( &md5_ctx, iv,  8 );
    mbedtls_md5_finish( &md5_ctx, md5sum );

    use_len = 16;
    if( keylen < 32 )
        use_len = keylen - 16;

    memcpy( key + 16, md5sum, use_len );

    mbedtls_md5_free( &md5_ctx );
    mbedtls_zeroize( md5sum, 16 );
}